

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Host.cpp
# Opt level: O0

void detectX86FamilyModel(uint EAX,uint *Family,uint *Model)

{
  uint *Model_local;
  uint *Family_local;
  uint EAX_local;
  
  *Family = EAX >> 8 & 0xf;
  *Model = EAX >> 4 & 0xf;
  if ((*Family == 6) || (*Family == 0xf)) {
    if (*Family == 0xf) {
      *Family = (EAX >> 0x14 & 0xff) + *Family;
    }
    *Model = (EAX >> 0x10 & 0xf) * 0x10 + *Model;
  }
  return;
}

Assistant:

static void detectX86FamilyModel(unsigned EAX, unsigned *Family,
                                 unsigned *Model) {
  *Family = (EAX >> 8) & 0xf; // Bits 8 - 11
  *Model = (EAX >> 4) & 0xf;  // Bits 4 - 7
  if (*Family == 6 || *Family == 0xf) {
    if (*Family == 0xf)
      // Examine extended family ID if family ID is F.
      *Family += (EAX >> 20) & 0xff; // Bits 20 - 27
    // Examine extended model ID if family ID is 6 or F.
    *Model += ((EAX >> 16) & 0xf) << 4; // Bits 16 - 19
  }
}